

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O2

int Cudd_bddGenConjDecomp(DdManager *dd,DdNode *f,DdNode ***conjuncts)

{
  int *piVar1;
  DdManager *pDVar2;
  int iVar3;
  st__table *table;
  char *value;
  NodeStat *pNVar4;
  st__generator *psVar5;
  long lVar6;
  st__table *ghTable;
  Conjuncts *pCVar7;
  DdNode **ppDVar8;
  int iVar9;
  DdNode *n;
  int iVar10;
  st__table *mintermTable;
  DdNode *pDVar11;
  double dVar12;
  st__table *local_78;
  Conjuncts *local_70;
  Conjuncts *local_68;
  DdManager *local_60;
  DdNode *local_58;
  DdNode ***local_50;
  Conjuncts *local_48;
  ulong local_40;
  char *key;
  
  one = dd->one;
  zero = (DdNode *)((ulong)one ^ 1);
  local_40 = (ulong)f & 0xfffffffffffffffe;
  local_60 = dd;
  local_58 = f;
  local_50 = conjuncts;
  do {
    while( true ) {
      pDVar2 = local_60;
      local_60->reordered = 0;
      table = st__init_table(st__ptrcmp,st__ptrhash);
      if (table == (st__table *)0x0) {
        mintermTable = (st__table *)0x0;
        local_78 = (st__table *)0x0;
        goto LAB_00610dc1;
      }
      value = (char *)malloc(8);
      if (value != (char *)0x0) break;
LAB_00610ed1:
      ghTable = (st__table *)0x0;
      mintermTable = (st__table *)0x0;
      local_78 = (st__table *)0x0;
LAB_00610ede:
      do {
        if (table != (st__table *)0x0) {
          do {
            psVar5 = st__init_gen(table);
          } while (psVar5 == (st__generator *)0x0);
          while (iVar3 = st__gen(psVar5,&key,(char **)&local_70), iVar3 != 0) {
            if (local_70 != (Conjuncts *)0x0) {
              free(local_70);
              local_70 = (Conjuncts *)0x0;
            }
          }
          st__free_gen(psVar5);
          st__free_table(table);
        }
        if (mintermTable != (st__table *)0x0) {
          psVar5 = st__init_gen(mintermTable);
          table = (st__table *)0x0;
          if (psVar5 == (st__generator *)0x0) goto LAB_00610ede;
          while (iVar3 = st__gen(psVar5,&key,(char **)&local_70), iVar3 != 0) {
            if (local_70 != (Conjuncts *)0x0) {
              free(local_70);
              local_70 = (Conjuncts *)0x0;
            }
          }
          st__free_gen(psVar5);
          st__free_table(mintermTable);
        }
        if (ghTable != (st__table *)0x0) {
          st__free_table(ghTable);
        }
        if (local_78 == (st__table *)0x0) goto LAB_00610fea;
        psVar5 = st__init_gen(local_78);
        pDVar2 = local_60;
        mintermTable = (st__table *)0x0;
        table = (st__table *)0x0;
      } while (psVar5 == (st__generator *)0x0);
      while (iVar3 = st__gen(psVar5,&key,(char **)&local_70), iVar3 != 0) {
        ConjunctsFree(pDVar2,local_70);
      }
      st__free_gen(psVar5);
      st__free_table(local_78);
LAB_00610fea:
      local_60->errorCode = CUDD_MEMORY_OUT;
      if (local_60->reordered != 1) {
        return 0;
      }
    }
    value[0] = '\0';
    value[1] = '\0';
    value[2] = '\0';
    value[3] = '\0';
    value[4] = '\x01';
    value[5] = '\0';
    value[6] = '\0';
    value[7] = '\0';
    iVar3 = st__insert(table,(char *)one,value);
    if ((iVar3 == -10000) || (pNVar4 = CreateBotDist(local_58,table), pNVar4 == (NodeStat *)0x0))
    goto LAB_00610ed1;
    iVar3 = pNVar4->distance;
    iVar10 = 5;
    if (5 < iVar3) {
      iVar10 = iVar3;
    }
    if (4 < iVar3) {
      psVar5 = st__init_gen(table);
      if (psVar5 == (st__generator *)0x0) goto LAB_00610ed1;
      local_68 = (Conjuncts *)((ulong)local_68 & 0xffffffff00000000);
      while (iVar3 = st__gen(psVar5,&key,(char **)&local_70), iVar3 != 0) {
        iVar3 = *(int *)((long)&local_70->g + 4);
        iVar9 = (int)local_68;
        if ((int)local_68 < iVar3) {
          iVar9 = iVar3;
        }
        local_68 = (Conjuncts *)CONCAT44(local_68._4_4_,iVar9);
      }
      local_48 = (Conjuncts *)CONCAT44(local_48._4_4_,iVar10);
      st__free_gen(psVar5);
      pDVar11 = local_58;
      iVar3 = Cudd_SupportSize(pDVar2,local_58);
      dVar12 = ldexp(1.0,iVar3);
      mintermTable = st__init_table(st__ptrcmp,st__ptrhash);
      if (mintermTable == (st__table *)0x0) goto LAB_00610ed1;
      dVar12 = CountMinterms(pDVar11,dVar12,mintermTable,pDVar2->err);
      if ((dVar12 != -1.0) || (NAN(dVar12))) {
        lVar6 = Cudd_Random();
        lastTimeG = (long)((uint)lVar6 & 1);
        local_78 = st__init_table(st__ptrcmp,st__ptrhash);
        if (local_78 == (st__table *)0x0) goto LAB_00610ec5;
        ghTable = st__init_table(st__ptrcmp,st__ptrhash);
        if (ghTable == (st__table *)0x0) {
          ghTable = (st__table *)0x0;
        }
        else {
          pCVar7 = BuildConjuncts(local_60,local_58,table,local_78,(int)local_48,(int)local_68,
                                  ghTable,mintermTable);
          if ((pCVar7 != (Conjuncts *)0x0) &&
             (local_68 = pCVar7, psVar5 = st__init_gen(table), psVar5 != (st__generator *)0x0)) {
            local_48 = local_68;
            while (iVar3 = st__gen(psVar5,&key,(char **)&local_70), iVar3 != 0) {
              if (local_70 != (Conjuncts *)0x0) {
                free(local_70);
                local_70 = (Conjuncts *)0x0;
              }
            }
            st__free_gen(psVar5);
            st__free_table(table);
            st__free_table(ghTable);
            psVar5 = st__init_gen(mintermTable);
            if (psVar5 != (st__generator *)0x0) {
              while (iVar3 = st__gen(psVar5,&key,(char **)&local_70), iVar3 != 0) {
                if (local_70 != (Conjuncts *)0x0) {
                  free(local_70);
                  local_70 = (Conjuncts *)0x0;
                }
              }
              st__free_gen(psVar5);
              st__free_table(mintermTable);
              pCVar7 = local_68;
              if (((ulong)local_48 & 1) != 0) {
                pCVar7 = (Conjuncts *)((ulong)local_68 ^ 1);
              }
              if (pCVar7 == (Conjuncts *)0x0) {
                pDVar11 = (DdNode *)0x0;
                n = (DdNode *)0x0;
              }
              else {
                pDVar11 = pCVar7->g;
                n = pCVar7->h;
                piVar1 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                if (((ulong)local_48 & 1) != 0) {
                  free((Conjuncts *)((ulong)local_68 ^ 1));
                }
              }
              psVar5 = st__init_gen(local_78);
              if (psVar5 != (st__generator *)0x0) {
                while (iVar3 = st__gen(psVar5,&key,(char **)&local_70), table = local_78, iVar3 != 0
                      ) {
                  ConjunctsFree(local_60,local_70);
                }
                goto LAB_00610e16;
              }
              mintermTable = (st__table *)0x0;
            }
LAB_00610dc1:
            ghTable = (st__table *)0x0;
            table = (st__table *)0x0;
          }
        }
      }
      else {
LAB_00610ec5:
        ghTable = (st__table *)0x0;
        local_78 = (st__table *)0x0;
      }
      goto LAB_00610ede;
    }
    n = pDVar2->one;
    *(int *)(local_40 + 4) = *(int *)(local_40 + 4) + 1;
    piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    psVar5 = st__init_gen(table);
    if (psVar5 == (st__generator *)0x0) goto LAB_00610ed1;
    while (iVar3 = st__gen(psVar5,&key,(char **)&local_70), pDVar11 = local_58, iVar3 != 0) {
      if (local_70 != (Conjuncts *)0x0) {
        free(local_70);
        local_70 = (Conjuncts *)0x0;
      }
    }
LAB_00610e16:
    st__free_gen(psVar5);
    st__free_table(table);
    pDVar2 = local_60;
    if (local_60->reordered != 1) {
      if (pDVar11 == one) {
        Cudd_RecursiveDeref(local_60,pDVar11);
        ppDVar8 = (DdNode **)malloc(8);
        *local_50 = ppDVar8;
        if (ppDVar8 != (DdNode **)0x0) {
          *ppDVar8 = n;
          return 1;
        }
      }
      else if (n == one) {
        Cudd_RecursiveDeref(local_60,n);
        ppDVar8 = (DdNode **)malloc(8);
        *local_50 = ppDVar8;
        n = pDVar11;
        if (ppDVar8 != (DdNode **)0x0) {
          *ppDVar8 = pDVar11;
          return 1;
        }
      }
      else {
        ppDVar8 = (DdNode **)malloc(0x10);
        *local_50 = ppDVar8;
        if (ppDVar8 != (DdNode **)0x0) {
          *ppDVar8 = pDVar11;
          ppDVar8[1] = n;
          return 2;
        }
        Cudd_RecursiveDeref(pDVar2,pDVar11);
      }
      Cudd_RecursiveDeref(pDVar2,n);
      pDVar2->errorCode = CUDD_MEMORY_OUT;
      return 0;
    }
  } while( true );
}

Assistant:

int
Cudd_bddGenConjDecomp(
  DdManager * dd /* manager */,
  DdNode * f /* function to be decomposed */,
  DdNode *** conjuncts /* address of the array of conjuncts */)
{
    int result;
    DdNode *glocal, *hlocal;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);
    
    do {
        dd->reordered = 0;
        result = cuddConjunctsAux(dd, f, &glocal, &hlocal);
    } while (dd->reordered == 1);

    if (result == 0) {
        return(0);
    }

    if (glocal != one) {
        if (hlocal != one) {
            *conjuncts = ABC_ALLOC(DdNode *,2);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                Cudd_RecursiveDeref(dd,hlocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            (*conjuncts)[1] = hlocal;
            return(2);
        } else {
            Cudd_RecursiveDeref(dd,hlocal);
            *conjuncts = ABC_ALLOC(DdNode *,1);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            return(1);
        }
    } else {
        Cudd_RecursiveDeref(dd,glocal);
        *conjuncts = ABC_ALLOC(DdNode *,1);
        if (*conjuncts == NULL) {
            Cudd_RecursiveDeref(dd,hlocal);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        (*conjuncts)[0] = hlocal;
        return(1);
    }

}